

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O1

Iterator * leveldb::GetFileIterator(void *arg,ReadOptions *options,Slice *file_value)

{
  uint8_t *buffer;
  Iterator *pIVar1;
  long in_FS_OFFSET;
  Slice local_38;
  Slice local_28;
  Status local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if (file_value->size_ == 0x10) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      pIVar1 = TableCache::NewIterator
                         ((TableCache *)arg,options,*(uint64_t *)file_value->data_,
                          *(uint64_t *)((long)file_value->data_ + 8),(Table **)0x0);
      return pIVar1;
    }
  }
  else {
    local_28.data_ = "FileReader invoked with unexpected value";
    local_28.size_ = 0x28;
    local_38.data_ = "";
    local_38.size_ = 0;
    Status::Status(&local_18,kCorruption,&local_28,&local_38);
    pIVar1 = NewErrorIterator(&local_18);
    if (local_18.state_ != (char *)0x0) {
      operator_delete__(local_18.state_);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      return pIVar1;
    }
  }
  __stack_chk_fail();
}

Assistant:

static Iterator* GetFileIterator(void* arg, const ReadOptions& options,
                                 const Slice& file_value) {
  TableCache* cache = reinterpret_cast<TableCache*>(arg);
  if (file_value.size() != 16) {
    return NewErrorIterator(
        Status::Corruption("FileReader invoked with unexpected value"));
  } else {
    return cache->NewIterator(options, DecodeFixed64(file_value.data()),
                              DecodeFixed64(file_value.data() + 8));
  }
}